

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O0

bool __thiscall HSet::debug(HSet *this)

{
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  uint *puVar4;
  uint *in_RDI;
  bool count_ok;
  bool entry_ok;
  HighsInt entry;
  bool pointer_ok;
  HighsInt pointer;
  HighsInt ix;
  HighsInt count;
  bool size_count_ok;
  HighsInt size;
  bool max_entry_ok;
  uint local_24;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar5;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar6;
  bool local_1;
  
  if ((in_RDI[8] & 1) == 0) {
    if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
      fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR setup_ not called\n");
    }
    local_1 = false;
  }
  else if ((int)in_RDI[0xc] < 0) {
    if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
      fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR max_entry_ = %d < %d\n",(ulong)in_RDI[0xc],0);
      print((HSet *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    local_1 = false;
  }
  else {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 2));
    bVar2 = (int)*in_RDI <= (int)sVar3;
    uVar6 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffe4);
    if (bVar2) {
      uVar5 = 0;
      for (local_24 = 0; (int)local_24 <= (int)in_RDI[0xc]; local_24 = local_24 + 1) {
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),
                                    (long)(int)local_24);
        uVar1 = *puVar4;
        if (uVar1 != 0xffffffff) {
          bVar2 = false;
          if (-1 < (int)uVar1) {
            bVar2 = (int)uVar1 < (int)*in_RDI;
          }
          if (!bVar2) {
            if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
              fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR pointer_[%d] = %d is not in [0, %d]\n",
                      (ulong)local_24,(ulong)uVar1,(ulong)*in_RDI);
              print((HSet *)CONCAT44(uVar6,uVar5));
            }
            return false;
          }
          uVar5 = uVar5 + 1;
          puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                      (long)(int)uVar1);
          if (*puVar4 != local_24) {
            if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
              fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR entry_[%d] is %d, not %d\n",(ulong)uVar1,
                      (ulong)*puVar4,(ulong)local_24);
              print((HSet *)CONCAT44(uVar6,uVar5));
            }
            return false;
          }
        }
      }
      if (uVar5 == *in_RDI) {
        local_1 = true;
      }
      else {
        if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
          fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR pointer_ has %d pointers, not %d\n",
                  (ulong)uVar5,(ulong)*in_RDI);
          print((HSet *)CONCAT44(uVar6,uVar5));
        }
        local_1 = false;
      }
    }
    else {
      if ((*(byte *)((long)in_RDI + 0x23) & 1) != 0) {
        fprintf(*(FILE **)(in_RDI + 10),"HSet: ERROR entry_.size() = %d is less than count_ = %d\n",
                sVar3 & 0xffffffff,(ulong)*in_RDI);
        print((HSet *)CONCAT44(uVar6,in_stack_ffffffffffffffe0));
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool HSet::debug() const {
  if (!setup_) {
    if (output_flag_) fprintf(log_file_, "HSet: ERROR setup_ not called\n");
    if (allow_assert_) assert(setup_);
    return false;
  }
  bool max_entry_ok = max_entry_ >= min_entry;
  if (!max_entry_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR max_entry_ = %" HIGHSINT_FORMAT
              " < %" HIGHSINT_FORMAT "\n",
              max_entry_, min_entry);
      print();
    }
    if (allow_assert_) assert(max_entry_ok);
    return false;
  }
  HighsInt size = entry_.size();
  bool size_count_ok = size >= count_;
  if (!size_count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR entry_.size() = %" HIGHSINT_FORMAT
              " is less than count_ = %" HIGHSINT_FORMAT "\n",
              size, count_);
      print();
    }
    if (allow_assert_) assert(size_count_ok);
    return false;
  }
  // Check pointer_ is consistent with count_ and entry_
  HighsInt count = 0;
  for (HighsInt ix = 0; ix <= max_entry_; ix++) {
    HighsInt pointer = pointer_[ix];
    if (pointer == no_pointer) continue;
    bool pointer_ok = pointer >= 0 && pointer < count_;
    if (!pointer_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR pointer_[%" HIGHSINT_FORMAT "] = %" HIGHSINT_FORMAT
                " is not in [0, %" HIGHSINT_FORMAT "]\n",
                ix, pointer, count_);
        print();
      }
      if (allow_assert_) assert(pointer_ok);
      return false;
    }
    count++;
    HighsInt entry = entry_[pointer];
    bool entry_ok = entry == ix;
    if (!entry_ok) {
      if (output_flag_) {
        fprintf(log_file_,
                "HSet: ERROR entry_[%" HIGHSINT_FORMAT "] is %" HIGHSINT_FORMAT
                ", not %" HIGHSINT_FORMAT "\n",
                pointer, entry, ix);
        print();
      }
      if (allow_assert_) assert(entry_ok);
      return false;
    }
  }
  bool count_ok = count == count_;
  if (!count_ok) {
    if (output_flag_) {
      fprintf(log_file_,
              "HSet: ERROR pointer_ has %" HIGHSINT_FORMAT
              " pointers, not %" HIGHSINT_FORMAT "\n",
              count, count_);
      print();
    }
    if (allow_assert_) assert(count_ok);
    return false;
  }
  return true;
}